

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiledata_unittest.cc
# Opt level: O1

string * __thiscall
(anonymous_namespace)::ProfileDataChecker::ValidateProfile_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  long lVar1;
  char *pcVar2;
  long lVar3;
  bool bVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  long *buf;
  __dev_t _Var9;
  long lVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  char *__s1;
  ulong uVar12;
  bool bVar13;
  undefined1 local_f8 [8];
  stat statbuf;
  FileDescriptor local_44;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_40;
  FileDescriptor fd;
  int local_34 [2];
  int chars_scanned;
  
  iVar7 = open(*this,0);
  local_44.fd_ = iVar7;
  if (iVar7 < 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"file open error","");
    goto LAB_0010b9bc;
  }
  iVar8 = fstat(iVar7,(stat *)local_f8);
  if (iVar8 != 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"fstat error","");
    goto LAB_0010b9bc;
  }
  buf = (long *)operator_new__(statbuf.st_rdev);
  _Var9 = anon_unknown.dwarf_3353::ReadPersistent(iVar7,buf,statbuf.st_rdev);
  if (_Var9 == statbuf.st_rdev) {
    if (statbuf.st_rdev < 0x40) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,"not enough data in profile for header + trailer",
                 "");
    }
    else if (*buf == 0) {
      if (buf[1] == 3) {
        if (buf[2] == 0) {
          if (buf[4] == 0) {
            paVar11 = &__return_storage_ptr__->field_2;
            uVar12 = 0x28;
            bVar13 = false;
            paStack_40 = paVar11;
            do {
              if (bVar13) {
                if ((long)uVar12 < (long)statbuf.st_rdev) {
                  if (*(char *)((long)buf + (long)((int)statbuf.st_rdev + -1)) == '\n')
                  goto LAB_0010bb3d;
                  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar11;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)__return_storage_ptr__,
                             "profile did not end with a complete line","");
                }
                else {
                  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar11;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)__return_storage_ptr__,"no list of mapped objects","");
                }
                break;
              }
              if (statbuf.st_rdev - 0x18 < uVar12) {
                (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar11;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)__return_storage_ptr__,"truncated sample header","");
                break;
              }
              lVar3 = *(long *)((long)buf + uVar12 + 8);
              lVar1 = lVar3 * 8 + 0x10;
              if ((long)(statbuf.st_rdev - lVar1) < (long)uVar12) {
                (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar11;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)__return_storage_ptr__,"truncated sample","");
LAB_0010bb09:
                bVar4 = false;
                paVar11 = paStack_40;
              }
              else {
                if (((lVar3 != 1) || (*(long *)((long)buf + uVar12) != 0)) ||
                   (*(long *)((long)buf + uVar12 + 0x10) != 0)) {
                  if (*(long *)((long)buf + uVar12) == 0) {
                    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar11;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)__return_storage_ptr__,"error in sample: sample count < 1",
                               "");
                  }
                  else {
                    if (lVar3 != 0) {
                      if (2 < lVar3 + 2U) {
                        lVar10 = 0;
                        do {
                          if (*(long *)((long)buf + lVar10 * 8 + uVar12 + 0x10) == 0) {
                            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar11;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)__return_storage_ptr__,"error in sample: NULL PC",
                                       "");
                            goto LAB_0010bb09;
                          }
                          lVar10 = lVar10 + 1;
                        } while (lVar3 != lVar10);
                      }
                      goto LAB_0010bae9;
                    }
                    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar11;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)__return_storage_ptr__,"error in sample: num_pcs < 1","");
                  }
                  goto LAB_0010bb09;
                }
                bVar13 = true;
LAB_0010bae9:
                uVar12 = uVar12 + lVar1;
                bVar4 = true;
              }
            } while (bVar4);
          }
          else {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)__return_storage_ptr__,"error in header: non-zero padding value",""
                      );
          }
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)__return_storage_ptr__,"error in header: non-zero format version","")
          ;
        }
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,"error in header: num_slots != 3","");
      }
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,"error in header: non-zero count","");
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"read of whole file failed","");
  }
  goto LAB_0010b9b4;
  while( true ) {
    statbuf.__glibc_reserved[2] = (__syscall_slong_t)strchr((char *)((long)buf + uVar12),10);
    *(char *)statbuf.__glibc_reserved[2] = '\0';
    __s1 = (char *)((long)buf + (uVar12 - 1));
    bVar6 = 1;
    do {
      bVar5 = bVar6;
      pcVar2 = __s1 + 1;
      __s1 = __s1 + 1;
      bVar6 = 0;
    } while (*pcVar2 == ' ');
    iVar7 = strncmp(__s1,"build=",6);
    bVar13 = iVar7 == 0;
    if (!bVar13) {
      local_34[0] = -1;
      __isoc99_sscanf(__s1,"%*x-%*x %*c%*c%*c%*c %*x %*x:%*x %*d %n",local_34);
      bVar13 = (bool)(bVar5 & 0 < local_34[0]);
    }
    if (!bVar13) {
      local_34[0] = -1;
      __isoc99_sscanf(__s1,"%*x-%*x: %n",local_34);
      bVar13 = 0 < local_34[0];
    }
    paVar11 = paStack_40;
    if (bVar13) {
      uVar12 = (uVar12 - (long)((long)buf + uVar12)) + statbuf.__glibc_reserved[2] + 1;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paStack_40;
      bVar13 = false;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,"unrecognized line in text section","");
    }
    if (!bVar13) break;
LAB_0010bb3d:
    if ((long)statbuf.st_rdev <= (long)uVar12) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar11;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      break;
    }
  }
LAB_0010b9b4:
  operator_delete__(buf);
LAB_0010b9bc:
  anon_unknown.dwarf_3353::FileDescriptor::~FileDescriptor(&local_44);
  return __return_storage_ptr__;
}

Assistant:

std::string ProfileDataChecker::ValidateProfile() {
  FileDescriptor fd(open(filename_.c_str(), O_RDONLY));
  if (fd.get() < 0)
    return "file open error";

  struct stat statbuf;
  if (fstat(fd.get(), &statbuf) != 0)
    return "fstat error";
  if (statbuf.st_size != static_cast<ssize_t>(statbuf.st_size))
    return "file impossibly large";
  ssize_t filesize = statbuf.st_size;

  scoped_array<char> filedata(new char[filesize]);
  if (ReadPersistent(fd.get(), filedata.get(), filesize) != filesize)
    return "read of whole file failed";

  // Must have enough data for the header and the trailer.
  if (filesize < (5 + 3) * sizeof(ProfileDataSlot))
    return "not enough data in profile for header + trailer";

  // Check the header
  if (reinterpret_cast<ProfileDataSlot*>(filedata.get())[0] != 0)
    return "error in header: non-zero count";
  if (reinterpret_cast<ProfileDataSlot*>(filedata.get())[1] != 3)
    return "error in header: num_slots != 3";
  if (reinterpret_cast<ProfileDataSlot*>(filedata.get())[2] != 0)
    return "error in header: non-zero format version";
  // Period (slot 3) can have any value.
  if (reinterpret_cast<ProfileDataSlot*>(filedata.get())[4] != 0)
    return "error in header: non-zero padding value";
  ssize_t cur_offset = 5 * sizeof(ProfileDataSlot);

  // While there are samples, skip them.  Each sample consists of
  // at least three slots.
  bool seen_trailer = false;
  while (!seen_trailer) {
    if (cur_offset > filesize - 3 * sizeof(ProfileDataSlot))
      return "truncated sample header";
    ProfileDataSlot* sample =
        reinterpret_cast<ProfileDataSlot*>(filedata.get() + cur_offset);
    ProfileDataSlot slots_this_sample = 2 + sample[1];
    ssize_t size_this_sample = slots_this_sample * sizeof(ProfileDataSlot);
    if (cur_offset > filesize - size_this_sample)
      return "truncated sample";

    if (sample[0] == 0 && sample[1] == 1 && sample[2] == 0) {
      seen_trailer = true;
    } else {
      if (sample[0] < 1)
        return "error in sample: sample count < 1";
      if (sample[1] < 1)
        return "error in sample: num_pcs < 1";
      for (int i = 2; i < slots_this_sample; i++) {
        if (sample[i] == 0)
          return "error in sample: NULL PC";
      }
    }
    cur_offset += size_this_sample;
  }

  // There must be at least one line in the (text) list of mapped objects,
  // and it must be terminated by a newline.  Note, the use of newline
  // here and below Might not be reasonable on non-UNIX systems.
  if (cur_offset >= filesize)
    return "no list of mapped objects";
  if (filedata[filesize - 1] != '\n')
    return "profile did not end with a complete line";

  while (cur_offset < filesize) {
    char* line_start = filedata.get() + cur_offset;

    // Find the end of the line, and replace it with a NUL for easier
    // scanning.
    char* line_end = strchr(line_start, '\n');
    *line_end = '\0';

    // Advance past any leading space.  It's allowed in some lines,
    // but not in others.
    bool has_leading_space = false;
    char* line_cur = line_start;
    while (*line_cur == ' ') {
      has_leading_space = true;
      line_cur++;
    }

    bool found_match = false;

    // Check for build lines.
    if (!found_match) {
      found_match = (strncmp(line_cur, "build=", 6) == 0);
      // Anything may follow "build=", and leading space is allowed.
    }

    // A line from ProcMapsIterator::FormatLine, of the form:
    //
    // 40000000-40015000 r-xp 00000000 03:01 12845071   /lib/ld-2.3.2.so
    //
    // Leading space is not allowed.  The filename may be omitted or
    // may consist of multiple words, so we scan only up to the
    // space before the filename.
    if (!found_match) {
      int chars_scanned = -1;
      sscanf(line_cur, "%*x-%*x %*c%*c%*c%*c %*x %*x:%*x %*d %n",
             &chars_scanned);
      found_match = (chars_scanned > 0 && !has_leading_space);
    }

    // A line from DumpAddressMap, of the form:
    //
    // 40000000-40015000: /lib/ld-2.3.2.so
    //
    // Leading space is allowed.  The filename may be omitted or may
    // consist of multiple words, so we scan only up to the space
    // before the filename.
    if (!found_match) {
      int chars_scanned = -1;
      sscanf(line_cur, "%*x-%*x: %n", &chars_scanned);
      found_match = (chars_scanned > 0);
    }

    if (!found_match)
      return "unrecognized line in text section";

    cur_offset += (line_end - line_start) + 1;
  }

  return kNoError;
}